

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::TestInfo::Run(TestInfo *this)

{
  long lVar1;
  TestEventRepeater *pTVar2;
  bool bVar3;
  UnitTestImpl *this_00;
  TimeInMillis TVar4;
  OsStackTraceGetterInterface *pOVar5;
  Test *this_01;
  TimeInMillis TVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->should_run_ == true) {
    this_00 = internal::GetUnitTestImpl();
    this_00->current_test_info_ = this;
    UnitTest::GetInstance();
    pTVar2 = ((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_;
    (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[7])(pTVar2,this);
    TVar4 = internal::GetTimeInMillis();
    pOVar5 = internal::UnitTestImpl::os_stack_trace_getter(this_00);
    (*pOVar5->_vptr_OsStackTraceGetterInterface[3])(pOVar5);
    this_01 = internal::
              HandleExceptionsInMethodIfSupported<testing::internal::TestFactoryBase,testing::Test*>
                        (this->factory_,0x11,(char *)0x0);
    bVar3 = Test::HasFatalFailure();
    if (!bVar3) {
      Test::Run(this_01);
    }
    pOVar5 = internal::UnitTestImpl::os_stack_trace_getter(this_00);
    (*pOVar5->_vptr_OsStackTraceGetterInterface[3])(pOVar5);
    internal::HandleExceptionsInMethodIfSupported<testing::Test,void>(this_01,0x15c156,(char *)0x0);
    TVar6 = internal::GetTimeInMillis();
    (this->result_).elapsed_time_ = TVar6 - TVar4;
    (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[9])(pTVar2,this);
    this_00->current_test_info_ = (TestInfo *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestInfo::Run() {
  if (!should_run_) return;

  // Tells UnitTest where to store test result.
  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_info(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Notifies the unit test event listeners that a test is about to start.
  repeater->OnTestStart(*this);

  const TimeInMillis start = internal::GetTimeInMillis();

  impl->os_stack_trace_getter()->UponLeavingGTest();

  // Creates the test object.
  Test* const test = internal::HandleExceptionsInMethodIfSupported(
      factory_, &internal::TestFactoryBase::CreateTest,
      "the test fixture's constructor");

  // Runs the test if the constructor didn't generate a fatal failure.
  // Note that the object will not be null
  if (!Test::HasFatalFailure()) {
    // This doesn't throw as all user code that can throw are wrapped into
    // exception handling code.
    test->Run();
  }

    // Deletes the test object.
    impl->os_stack_trace_getter()->UponLeavingGTest();
    internal::HandleExceptionsInMethodIfSupported(
        test, &Test::DeleteSelf_, "the test fixture's destructor");

  result_.set_elapsed_time(internal::GetTimeInMillis() - start);

  // Notifies the unit test event listener that a test has just finished.
  repeater->OnTestEnd(*this);

  // Tells UnitTest to stop associating assertion results to this
  // test.
  impl->set_current_test_info(NULL);
}